

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion __thiscall QRegion::subtracted(QRegion *this,QRegion *r)

{
  QRegionPrivate *pQVar1;
  QRegionPrivate *pQVar2;
  bool bVar3;
  long *in_RDX;
  
  pQVar1 = r->d->qt_rgn;
  if ((((pQVar1 == (QRegionPrivate *)0x0) || (pQVar1->numRects == 0)) ||
      (pQVar2 = *(QRegionPrivate **)(*in_RDX + 8), pQVar2 == (QRegionPrivate *)0x0)) ||
     (pQVar2->numRects == 0)) {
LAB_003d0489:
    QRegion(this,r);
  }
  else {
    bVar3 = QRegionPrivate::contains(pQVar2,&pQVar1->extents);
    if (!bVar3) {
      pQVar1 = r->d->qt_rgn;
      pQVar2 = ((QRegionData *)*in_RDX)->qt_rgn;
      if ((((pQVar1->extents).x2.m_i < (pQVar2->extents).x1.m_i) ||
          ((pQVar2->extents).x2.m_i < (pQVar1->extents).x1.m_i)) ||
         (((pQVar1->extents).y2.m_i < (pQVar2->extents).y1.m_i ||
          ((pQVar2->extents).y2.m_i < (pQVar1->extents).y1.m_i)))) goto LAB_003d0489;
      if ((r->d != (QRegionData *)*in_RDX) && (bVar3 = EqualRegion(pQVar1,pQVar2), !bVar3)) {
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion(this);
        detach(this);
        SubtractRegion(r->d->qt_rgn,*(QRegionPrivate **)(*in_RDX + 8),this->d->qt_rgn);
        return (QRegion)(QRegionData *)this;
      }
    }
    QRegion(this);
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QRegion::subtracted(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return QRegion();
    if (!EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return *this;
    if (d == r.d || EqualRegion(d->qt_rgn, r.d->qt_rgn))
        return QRegion();

#ifdef QT_REGION_DEBUG
    d->qt_rgn->selfTest();
    r.d->qt_rgn->selfTest();
#endif

    QRegion result;
    result.detach();
    SubtractRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
#ifdef QT_REGION_DEBUG
    result.d->qt_rgn->selfTest();
#endif
    return result;
}